

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

_Bool ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *hash,ckh_keycomp_t *keycomp)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uintptr_t uVar5;
  void *pvVar6;
  undefined8 uVar7;
  arena_t *paVar8;
  arena_t *paVar9;
  ckhc_t *key;
  rtree_leaf_elm_t *prVar10;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  rtree_ctx_t *prVar16;
  ulong uVar17;
  rtree_ctx_t local_1b0;
  
  ckh->prng_state = 0x2a;
  ckh->count = 0;
  uVar13 = 0xffffffff;
  do {
    bVar12 = (char)uVar13 + 3;
    uVar13 = uVar13 + 1;
  } while ((ulong)(1L << (bVar12 & 0x3f)) < (minitems + (minitems % 3 ^ 3)) / 3 << 2);
  ckh->lg_minbuckets = uVar13;
  ckh->lg_curbuckets = uVar13;
  ckh->hash = hash;
  uVar14 = 0x10L << (bVar12 & 0x3f);
  ckh->keycomp = keycomp;
  paVar9 = (arena_t *)0xf;
  if (uVar14 < 0x3801) {
    uVar13 = (int)uVar14 + 0x3fU & 0x7fc0;
    if (uVar13 < 0x1001) {
      sVar11 = sz_index2size_tab[sz_size2index_tab[uVar13 >> 3]];
    }
    else {
      uVar14 = (ulong)uVar13 * 2 - 1;
      lVar15 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      paVar8 = (arena_t *)~(-1L << ((char)lVar15 - 3U & 0x3f));
      if ((uint)lVar15 < 7) {
        paVar8 = paVar9;
      }
      sVar11 = ~(ulong)paVar8 & (long)&paVar8->nthreads[0].repr + (ulong)uVar13;
    }
    uVar17 = 0x4000;
    if (sVar11 < 0x4000) {
LAB_0011496a:
      uVar17 = sVar11;
      if (sVar11 + 0x8fffffffffffffff < 0x9000000000000000) {
        paVar9 = (arena_t *)0x1;
        goto LAB_00114a6a;
      }
    }
  }
  else {
    uVar17 = 0x4000;
    if (0x4000 < uVar14) {
      if (uVar14 < 0x7000000000000001) {
        uVar17 = (0x20L << (bVar12 & 0x3f)) - 1;
        lVar15 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        paVar8 = (arena_t *)~(-1L << ((char)lVar15 - 3U & 0x3f));
        if ((uint)lVar15 < 7) {
          paVar8 = paVar9;
        }
        sVar11 = ~(ulong)paVar8 & (long)&paVar8->nthreads[0].repr + uVar14;
      }
      else {
        sVar11 = 0;
      }
      paVar9 = (arena_t *)0x1;
      if (0xffffffffffffefff < sVar11 || sVar11 < uVar14) goto LAB_00114a6a;
      goto LAB_0011496a;
    }
  }
  paVar9 = arena_ichoose(tsd,paVar9);
  key = (ckhc_t *)arena_palloc((tsdn_t *)tsd,paVar9,uVar17,0x40,true,(tcache_t *)0x0);
  if (key != (ckhc_t *)0x0) {
    if (tsd == (tsd_t *)0x0) {
      prVar16 = &local_1b0;
      rtree_ctx_data_init(prVar16);
    }
    else {
      prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar13 = (uint)((ulong)key >> 0x1e) & 0xf;
    uVar17 = (ulong)key & 0xffffffffc0000000;
    uVar14 = (ulong)(uVar13 << 4);
    puVar2 = (ulong *)((long)&prVar16->cache[0].leafkey + uVar14);
    uVar5 = *(uintptr_t *)((long)&prVar16->cache[0].leafkey + uVar14);
    if (uVar5 == uVar17) {
      prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar16->l2_cache[0].leafkey == uVar17) {
      prVar10 = prVar16->l2_cache[0].leaf;
      prVar16->l2_cache[0].leafkey = uVar5;
      prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar17;
      puVar2[1] = (ulong)prVar10;
      prVar10 = (rtree_leaf_elm_t *)
                ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      for (lVar15 = 0x118; lVar15 != 0x188; lVar15 = lVar15 + 0x10) {
        if (*(ulong *)((long)prVar16->cache + lVar15 + -8) == uVar17) {
          uVar14 = *(ulong *)((long)&prVar16->cache[0].leafkey + lVar15);
          puVar3 = (undefined8 *)((long)prVar16->cache + lVar15 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)prVar16->cache + lVar15 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(uintptr_t *)((long)prVar16->cache + lVar15 + -0x18) = uVar5;
          *(ulong *)((long)(prVar16->cache + -1) + lVar15) = puVar2[1];
          *puVar2 = uVar17;
          puVar2[1] = uVar14;
          prVar10 = (rtree_leaf_elm_t *)(((uint)((ulong)key >> 9) & 0x1ffff8) + uVar14);
          goto LAB_001149fe;
        }
      }
      prVar10 = rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&extents_rtree,prVar16,(uintptr_t)key,true,false);
    }
LAB_001149fe:
    pvVar6 = arenas[*(uint *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe)
                    & 0xfff].repr;
    if (tsd == (tsd_t *)0x0) {
      prVar16 = &local_1b0;
      rtree_ctx_data_init(prVar16);
    }
    else {
      prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar14 = (ulong)(uVar13 << 4);
    puVar2 = (ulong *)((long)&prVar16->cache[0].leafkey + uVar14);
    uVar5 = *(uintptr_t *)((long)&prVar16->cache[0].leafkey + uVar14);
    if (uVar5 == uVar17) {
      prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (prVar16->l2_cache[0].leafkey == uVar17) {
      prVar10 = prVar16->l2_cache[0].leaf;
      prVar16->l2_cache[0].leafkey = uVar5;
      prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar17;
      puVar2[1] = (ulong)prVar10;
      prVar10 = (rtree_leaf_elm_t *)
                ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      for (lVar15 = 0x118; lVar15 != 0x188; lVar15 = lVar15 + 0x10) {
        if (*(ulong *)((long)prVar16->cache + lVar15 + -8) == uVar17) {
          uVar14 = *(ulong *)((long)&prVar16->cache[0].leafkey + lVar15);
          puVar3 = (undefined8 *)((long)prVar16->cache + lVar15 + -0x18);
          uVar7 = puVar3[1];
          puVar4 = (undefined8 *)((long)prVar16->cache + lVar15 + -8);
          *puVar4 = *puVar3;
          puVar4[1] = uVar7;
          *(uintptr_t *)((long)prVar16->cache + lVar15 + -0x18) = uVar5;
          *(ulong *)((long)(prVar16->cache + -1) + lVar15) = puVar2[1];
          *puVar2 = uVar17;
          puVar2[1] = uVar14;
          prVar10 = (rtree_leaf_elm_t *)(((uint)((ulong)key >> 9) & 0x1ffff8) + uVar14);
          goto LAB_00114a4f;
        }
      }
      prVar10 = rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&extents_rtree,prVar16,(uintptr_t)key,true,false);
    }
LAB_00114a4f:
    LOCK();
    plVar1 = (long *)((long)pvVar6 + 0x68);
    *plVar1 = *plVar1 + sz_index2size_tab[(ulong)(prVar10->le_bits).repr >> 0x30];
    UNLOCK();
  }
  paVar9 = (arena_t *)(ulong)(key == (ckhc_t *)0x0);
  ckh->tab = key;
LAB_00114a6a:
  return SUB81(paVar9,0);
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}